

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O2

void rsg::addNewUniforms(vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                         *uniforms,
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *addedUniforms,Shader *shader)

{
  iterator iVar1;
  pointer ppSVar2;
  ShaderInput *uniform;
  allocator<char> local_61;
  ShaderInput *local_60;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *local_58;
  key_type local_50;
  
  local_58 = uniforms;
  for (ppSVar2 = (shader->m_uniforms).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppSVar2 !=
      (shader->m_uniforms).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    local_60 = *ppSVar2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(local_60->m_variable->m_name)._M_dataplus._M_p,&local_61);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&addedUniforms->_M_t,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if ((_Rb_tree_header *)iVar1._M_node == &(addedUniforms->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(local_60->m_variable->m_name)._M_dataplus._M_p,&local_61);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)addedUniforms,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::push_back
                (local_58,&local_60);
    }
  }
  return;
}

Assistant:

void addNewUniforms (vector<const ShaderInput*>& uniforms, set<string>& addedUniforms, const Shader& shader)
{
	const vector<ShaderInput*>& shaderUniforms = shader.getUniforms();
	for (vector<ShaderInput*>::const_iterator i = shaderUniforms.begin(); i != shaderUniforms.end(); i++)
	{
		const ShaderInput* uniform = *i;
		if (addedUniforms.find(uniform->getVariable()->getName()) == addedUniforms.end())
		{
			addedUniforms.insert(uniform->getVariable()->getName());
			uniforms.push_back(uniform);
		}
	}
}